

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_27f4c0::PeerManagerImpl::IsBlockRequestedFromOutbound
          (PeerManagerImpl *this,uint256 *hash)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var2;
  _Self __tmp;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar3;
  PeerRef peer;
  CValidationInterface local_38;
  NetEventsInterface local_30;
  uint64_t local_28;
  
  local_28 = *(uint64_t *)(in_FS_OFFSET + 0x28);
  pVar3 = std::
          multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
          ::equal_range(&this->mapBlocksInFlight,hash);
  _Var2 = pVar3.first._M_node;
  do {
    if (_Var2._M_node == pVar3.second._M_node._M_node) {
      bVar1 = false;
LAB_001dd698:
      if (*(uint64_t *)(in_FS_OFFSET + 0x28) == local_28) {
        return bVar1;
      }
      __stack_chk_fail();
    }
    GetPeerRef((PeerManagerImpl *)&stack0xffffffffffffffc8,(NodeId)this);
    if ((local_38._vptr_CValidationInterface != (_func_int **)0x0) &&
       (*(char *)(local_38._vptr_CValidationInterface + 3) != '\x01')) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._vptr_NetEventsInterface !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._vptr_NetEventsInterface
                  );
      }
      bVar1 = true;
      goto LAB_001dd698;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._vptr_NetEventsInterface !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._vptr_NetEventsInterface);
    }
    _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node);
  } while( true );
}

Assistant:

bool PeerManagerImpl::IsBlockRequestedFromOutbound(const uint256& hash)
{
    for (auto range = mapBlocksInFlight.equal_range(hash); range.first != range.second; range.first++) {
        auto [nodeid, block_it] = range.first->second;
        PeerRef peer{GetPeerRef(nodeid)};
        if (peer && !peer->m_is_inbound) return true;
    }

    return false;
}